

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

char * UpnpGetServerIp6Address(void)

{
  char *local_10;
  
  if (UpnpSdkInit == 1) {
    local_10 = gIF_IPV6;
  }
  else {
    local_10 = (char *)0x0;
  }
  return local_10;
}

Assistant:

char *UpnpGetServerIp6Address(void)
{
#ifdef UPNP_ENABLE_IPV6
	if (UpnpSdkInit != 1)
		return NULL;

	return gIF_IPV6;
#else
	return NULL;
#endif
}